

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_dogstatsd.cpp
# Opt level: O1

string * __thiscall
datadog::Dogstatsd::format
          (string *__return_storage_ptr__,Dogstatsd *this,string *name,string *value,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tags,double rate)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  ostream *poVar4;
  char *pcVar5;
  pointer pbVar6;
  ostringstream statd;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,(value->_M_dataplus)._M_p,value->_M_string_length);
  if (rate < 1.0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"|@",2);
    std::ostream::_M_insert<double>(rate);
  }
  pbVar1 = (tags->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (tags->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 != pbVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"|#",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
    pbVar3 = pbVar1;
    while (pbVar6 = pbVar3 + 1,
          pbVar6 != (tags->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(pbVar6->_M_dataplus)._M_p,pbVar3[1]._M_string_length);
      pbVar3 = pbVar6;
    }
  }
  if ((this->global_tags_str)._M_string_length != 0) {
    pcVar5 = ",";
    if (pbVar2 == pbVar1) {
      pcVar5 = "|#";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,pcVar5,(ulong)(pbVar2 == pbVar1) + 1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(this->global_tags_str)._M_dataplus._M_p,
               (this->global_tags_str)._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Dogstatsd::format( std::string name, std::string value, std::vector<std::string> tags, double rate){
    bool tagging = false;
    std::ostringstream statd;

    statd << name << ":" << value;
    if (rate < 1) {
      statd << "|@" << rate;
    }

    if (tags.size()) {
      tagging = true;
      // TODO: remove newlines from the tags.
      std::vector<std::string>::iterator it = tags.begin();

      statd << "|#" << *it++;
      for( ; it != tags.end() ; ++it) {
        statd << "," << *it;
      }
    }

    if (!global_tags_str.empty()) {
      if (!tagging) {
        statd << "|#" ;
      } else {
        statd << "," ;
      }
      statd << global_tags_str;
    }
    return statd.str();
  }